

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O2

void __thiscall OpenMesh::ArrayKernel::init_bit_masks(ArrayKernel *this,BitMaskContainer *_bmc)

{
  value_type_conflict1 local_1c;
  
  for (local_1c = 0x100; local_1c != 0; local_1c = local_1c * 2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(_bmc,&local_1c);
  }
  return;
}

Assistant:

void ArrayKernel::init_bit_masks(BitMaskContainer& _bmc)
{
  for (unsigned int i = Attributes::UNUSED; i != 0; i <<= 1)
  {
    _bmc.push_back(i);
  }
}